

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubDefinition
          (ServiceGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  io::Printer::Print(printer,&this->vars_,
                     "class $dllexport$$classname$_Stub : public $classname$ {\n public:\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&this->vars_,
                     "$classname$_Stub(::google::protobuf::RpcChannel* channel);\n$classname$_Stub(::google::protobuf::RpcChannel* channel,\n                 ::google::protobuf::Service::ChannelOwnership ownership);\n~$classname$_Stub();\n\ninline ::google::protobuf::RpcChannel* channel() { return channel_; }\n\n// implements $classname$ ------------------------------------------\n\n"
                    );
  GenerateMethodSignatures(this,NON_VIRTUAL,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->vars_,
                     " private:\n  ::google::protobuf::RpcChannel* channel_;\n  bool owns_channel_;\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n};\n\n"
                    );
  return;
}

Assistant:

void ServiceGenerator::GenerateStubDefinition(io::Printer* printer) {
  printer->Print(vars_,
    "class $dllexport$$classname$_Stub : public $classname$ {\n"
    " public:\n");

  printer->Indent();

  printer->Print(vars_,
    "$classname$_Stub(::google::protobuf::RpcChannel* channel);\n"
    "$classname$_Stub(::google::protobuf::RpcChannel* channel,\n"
    "                 ::google::protobuf::Service::ChannelOwnership ownership);\n"
    "~$classname$_Stub();\n"
    "\n"
    "inline ::google::protobuf::RpcChannel* channel() { return channel_; }\n"
    "\n"
    "// implements $classname$ ------------------------------------------\n"
    "\n");

  GenerateMethodSignatures(NON_VIRTUAL, printer);

  printer->Outdent();
  printer->Print(vars_,
    " private:\n"
    "  ::google::protobuf::RpcChannel* channel_;\n"
    "  bool owns_channel_;\n"
    "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n"
    "};\n"
    "\n");
}